

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void luby_test(void)

{
  int x;
  double dVar1;
  
  for (x = 0; x != 0x14; x = x + 1) {
    dVar1 = luby(2.0,x);
    printf("%d ",(ulong)(uint)(int)dVar1);
  }
  putchar(10);
  return;
}

Assistant:

void luby_test()
{
    int i;
    for ( i = 0; i < 20; i++ )
        printf( "%d ", (int)luby(2,i) );
    printf( "\n" );
}